

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

bool __thiscall wabt::WastLexer::ReadHexNum(WastLexer *this)

{
  bool bVar1;
  int iVar2;
  WastLexer *this_local;
  
  iVar2 = PeekChar(this);
  bVar1 = IsHexDigit(iVar2);
  if (!bVar1) {
    return false;
  }
  ReadChar(this);
  bVar1 = MatchChar(this,'_');
  if (!bVar1) {
    iVar2 = PeekChar(this);
    bVar1 = IsHexDigit(iVar2);
    if (!bVar1) {
      return true;
    }
  }
  bVar1 = ReadHexNum(this);
  return bVar1;
}

Assistant:

bool WastLexer::ReadHexNum() {
  if (IsHexDigit(PeekChar())) {
    ReadChar();
    return MatchChar('_') || IsHexDigit(PeekChar()) ? ReadHexNum() : true;
  }
  return false;
}